

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

void __thiscall spvtools::opt::Loop::SetPreHeaderBlock(Loop *this,BasicBlock *preheader)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Function *in_RAX;
  Function *local_28;
  
  if (preheader != (BasicBlock *)0x0) {
    local_28 = in_RAX;
    bVar1 = IsInsideLoop(this,preheader);
    if (bVar1) {
      __assert_fail("!IsInsideLoop(preheader) && \"The preheader block is in the loop\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x13e,"void spvtools::opt::Loop::SetPreHeaderBlock(BasicBlock *)");
    }
    BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffd8);
    if (*(Op *)&(local_28->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                _vptr_IntrusiveNodeBase != OpBranch) {
      __assert_fail("preheader->tail()->opcode() == spv::Op::OpBranch && \"The preheader block does not unconditionally branch to the header \" \"block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x141,"void spvtools::opt::Loop::SetPreHeaderBlock(BasicBlock *)");
    }
    BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffd8);
    uVar2 = Instruction::GetSingleWordOperand((Instruction *)local_28,0);
    uVar3 = BasicBlock::id(this->loop_header_);
    if (uVar2 != uVar3) {
      __assert_fail("preheader->tail()->GetSingleWordOperand(0) == GetHeaderBlock()->id() && \"The preheader block does not unconditionally branch to the header \" \"block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x145,"void spvtools::opt::Loop::SetPreHeaderBlock(BasicBlock *)");
    }
  }
  this->loop_preheader_ = preheader;
  return;
}

Assistant:

void Loop::SetPreHeaderBlock(BasicBlock* preheader) {
  if (preheader) {
    assert(!IsInsideLoop(preheader) && "The preheader block is in the loop");
    assert(preheader->tail()->opcode() == spv::Op::OpBranch &&
           "The preheader block does not unconditionally branch to the header "
           "block");
    assert(preheader->tail()->GetSingleWordOperand(0) ==
               GetHeaderBlock()->id() &&
           "The preheader block does not unconditionally branch to the header "
           "block");
  }
  loop_preheader_ = preheader;
}